

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O2

size_t t_mult(size_t a,size_t k,int *ok)

{
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  sVar1 = 0;
  while (bVar4 = k != 0, k = k - 1, bVar4) {
    if (*ok == 0) {
      uVar3 = 0;
      sVar1 = 0;
    }
    else {
      uVar2 = sVar1 + a;
      if (sVar1 <= a) {
        sVar1 = a;
      }
      bVar4 = sVar1 <= uVar2;
      if (!bVar4) {
        uVar2 = 0;
      }
      uVar3 = (uint)bVar4;
      sVar1 = uVar2;
    }
    *ok = uVar3;
  }
  return sVar1;
}

Assistant:

static size_t t_mult (size_t a, size_t k, int *ok)
{
    size_t i, s = 0 ;
    for (i = 0 ; i < k ; i++)
    {
	s = t_add (s, a, ok) ;
    }
    return (s) ;
}